

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.h
# Opt level: O1

void __thiscall
ON_3dmAnimationProperties::ON_3dmAnimationProperties(ON_3dmAnimationProperties *this)

{
  this->m_CaptureTypes = none;
  ON_wString::ON_wString(&this->m_sFileExtension,L"jpg");
  ON_wString::ON_wString(&this->m_sCaptureMethod);
  ON_wString::ON_wString(&this->m_sHtmlFilename);
  ON_wString::ON_wString(&this->m_sViewport);
  (this->m_idDisplayMode).Data1 = 0;
  (this->m_idDisplayMode).Data2 = 0;
  (this->m_idDisplayMode).Data3 = 0;
  (this->m_idDisplayMode).Data4[0] = '\0';
  (this->m_idDisplayMode).Data4[1] = '\0';
  (this->m_idDisplayMode).Data4[2] = '\0';
  (this->m_idDisplayMode).Data4[3] = '\0';
  (this->m_idDisplayMode).Data4[4] = '\0';
  (this->m_idDisplayMode).Data4[5] = '\0';
  (this->m_idDisplayMode).Data4[6] = '\0';
  (this->m_idDisplayMode).Data4[7] = '\0';
  ON_3dPointArray::ON_3dPointArray(&this->m_aCameraPoints);
  ON_3dPointArray::ON_3dPointArray(&this->m_aTargetPoints);
  this->m_iFrameCount = 100;
  this->m_iCurrentFrame = 1;
  (this->m_idCameraPath).Data1 = 0;
  (this->m_idCameraPath).Data2 = 0;
  (this->m_idCameraPath).Data3 = 0;
  (this->m_idCameraPath).Data4[0] = '\0';
  (this->m_idCameraPath).Data4[1] = '\0';
  (this->m_idCameraPath).Data4[2] = '\0';
  (this->m_idCameraPath).Data4[3] = '\0';
  (this->m_idCameraPath).Data4[4] = '\0';
  (this->m_idCameraPath).Data4[5] = '\0';
  (this->m_idCameraPath).Data4[6] = '\0';
  (this->m_idCameraPath).Data4[7] = '\0';
  (this->m_idTargetPath).Data1 = 0;
  (this->m_idTargetPath).Data2 = 0;
  (this->m_idTargetPath).Data3 = 0;
  (this->m_idTargetPath).Data4[0] = '\0';
  (this->m_idTargetPath).Data4[1] = '\0';
  (this->m_idTargetPath).Data4[2] = '\0';
  (this->m_idTargetPath).Data4[3] = '\0';
  (this->m_idTargetPath).Data4[4] = '\0';
  (this->m_idTargetPath).Data4[5] = '\0';
  (this->m_idTargetPath).Data4[6] = '\0';
  (this->m_idTargetPath).Data4[7] = '\0';
  this->m_dLatitude = 51.2838;
  this->m_dLongitude = 0.0;
  this->m_dNorthAngle = 0.0;
  this->m_iStartDay = 1;
  this->m_iStartMonth = 6;
  this->m_iStartYear = 0x7da;
  this->m_iEndDay = 1;
  this->m_iEndMonth = 6;
  this->m_iEndYear = 0x7dc;
  this->m_iStartHour = 6;
  this->m_iStartMinutes = 0;
  this->m_iStartSeconds = 0;
  this->m_iEndHour = 0x12;
  this->m_iEndMinutes = 0;
  this->m_iEndSeconds = 0x3b;
  this->m_iDaysBetweenFrames = 0x1e;
  this->m_iMinutesBetweenFrames = 0x1e;
  this->m_iLightIndex = -1;
  ON_wString::ON_wString(&this->m_sFolderName);
  (this->m_aImages)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_008179b0;
  (this->m_aImages).m_a = (ON_wString *)0x0;
  (this->m_aImages).m_count = 0;
  (this->m_aImages).m_capacity = 0;
  (this->m_aDates)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_008179b0;
  (this->m_aDates).m_a = (ON_wString *)0x0;
  (this->m_aDates).m_count = 0;
  (this->m_aDates).m_capacity = 0;
  this->m_bRenderFull = false;
  this->m_bRenderPreview = false;
  this->m_reserved1 = '\0';
  this->m_reserved2 = '\0';
  this->m_reserved4 = 0;
  this->reserved = 0;
  return;
}

Assistant:

~ON_3dmAnimationProperties() = default;